

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O3

void terminal_alloc(EditLine *el,termcapstr *t,char *cap)

{
  char **ppcVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  char *pcVar5;
  char cVar6;
  size_t sVar7;
  size_t sVar8;
  char *pcVar9;
  long lVar10;
  bool bVar11;
  char termbuf [2048];
  undefined8 local_840;
  char local_838 [2056];
  
  ppcVar1 = (el->el_terminal).t_str;
  lVar10 = (long)(t + -0x12655) >> 1;
  memset(local_838,0,0x800);
  if ((cap == (char *)0x0) || (*cap == '\0')) {
    *(undefined8 *)((long)ppcVar1 + lVar10) = 0;
  }
  else {
    sVar2 = strlen(cap);
    pcVar9 = *(char **)((long)ppcVar1 + lVar10);
    if (pcVar9 == (char *)0x0) {
      if (sVar2 == 0) {
        return;
      }
    }
    else {
      sVar3 = strlen(pcVar9);
      if (sVar2 <= sVar3) {
        strcpy(pcVar9,cap);
        return;
      }
    }
    sVar8 = (el->el_terminal).t_loc;
    if (sVar8 + 3 < 0x800) {
      pcVar9 = (el->el_terminal).t_buf + sVar8;
      *(char **)((long)ppcVar1 + lVar10) = pcVar9;
      strcpy(pcVar9,cap);
      lVar10 = (el->el_terminal).t_loc + sVar2;
    }
    else {
      sVar8 = 0;
      uVar4 = 0;
      do {
        pcVar5 = *(char **)((long)ppcVar1 + uVar4);
        if ((pcVar5 != (char *)0x0) && (cVar6 = *pcVar5, pcVar5 != pcVar9 && cVar6 != '\0')) {
          sVar8 = sVar8 + 1;
          do {
            sVar7 = sVar8;
            pcVar5 = pcVar5 + 1;
            local_838[sVar7 - 1] = cVar6;
            cVar6 = *pcVar5;
            sVar8 = sVar7 + 1;
          } while (cVar6 != '\0');
          local_838[sVar7] = '\0';
        }
        bVar11 = uVar4 < 0x130;
        uVar4 = uVar4 + 8;
      } while (bVar11);
      local_840 = sVar2;
      memcpy((el->el_terminal).t_buf,local_838,0x800);
      (el->el_terminal).t_loc = sVar8;
      if (sVar8 - 0x7fd < 0xfffffffffffff800) {
        fwrite("Out of termcap string space.\n",0x1d,1,(FILE *)el->el_errfile);
        return;
      }
      pcVar9 = (el->el_terminal).t_buf + sVar8;
      *(char **)((long)ppcVar1 + lVar10) = pcVar9;
      strcpy(pcVar9,cap);
      lVar10 = (el->el_terminal).t_loc + local_840;
    }
    (el->el_terminal).t_loc = lVar10 + 1;
  }
  return;
}

Assistant:

static void
terminal_alloc(EditLine *el, const struct termcapstr *t, const char *cap)
{
	char termbuf[TC_BUFSIZE];
	size_t tlen, clen;
	char **tlist = el->el_terminal.t_str;
	char **tmp, **str = &tlist[t - tstr];

	(void) memset(termbuf, 0, sizeof(termbuf));
	if (cap == NULL || *cap == '\0') {
		*str = NULL;
		return;
	} else
		clen = strlen(cap);

	tlen = *str == NULL ? 0 : strlen(*str);

	/*
         * New string is shorter; no need to allocate space
         */
	if (clen <= tlen) {
		if (*str)
			(void) strcpy(*str, cap);	/* XXX strcpy is safe */
		return;
	}
	/*
         * New string is longer; see if we have enough space to append
         */
	if (el->el_terminal.t_loc + 3 < TC_BUFSIZE) {
						/* XXX strcpy is safe */
		(void) strcpy(*str = &el->el_terminal.t_buf[
		    el->el_terminal.t_loc], cap);
		el->el_terminal.t_loc += clen + 1;	/* one for \0 */
		return;
	}
	/*
         * Compact our buffer; no need to check compaction, cause we know it
         * fits...
         */
	tlen = 0;
	for (tmp = tlist; tmp < &tlist[T_str]; tmp++)
		if (*tmp != NULL && **tmp != '\0' && *tmp != *str) {
			char *ptr;

			for (ptr = *tmp; *ptr != '\0'; termbuf[tlen++] = *ptr++)
				continue;
			termbuf[tlen++] = '\0';
		}
	memcpy(el->el_terminal.t_buf, termbuf, TC_BUFSIZE);
	el->el_terminal.t_loc = tlen;
	if (el->el_terminal.t_loc + 3 >= TC_BUFSIZE) {
		(void) fprintf(el->el_errfile,
		    "Out of termcap string space.\n");
		return;
	}
					/* XXX strcpy is safe */
	(void) strcpy(*str = &el->el_terminal.t_buf[el->el_terminal.t_loc],
	    cap);
	el->el_terminal.t_loc += (size_t)clen + 1;	/* one for \0 */
	return;
}